

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

Expression *
wasm::Bits::makePackedFieldGet(Expression *value,Field *field,bool signed_,Module *wasm)

{
  uint uVar1;
  uint uVar2;
  Expression *pEVar3;
  Const *pCVar4;
  Binary *this;
  Builder local_28;
  Builder builder;
  
  if ((field->packedType != not_packed) && ((field->type).id != 2)) {
    __assert_fail("type == Type::i32 && \"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x28a,"bool wasm::Field::isPacked() const");
  }
  this = (Binary *)value;
  if (field->packedType != not_packed) {
    if (signed_) {
      uVar1 = Field::getByteSize(field);
      pEVar3 = makeSignExt(value,uVar1,wasm);
      return pEVar3;
    }
    local_28.wasm = wasm;
    uVar2 = Field::getByteSize(field);
    uVar1 = 0xffffffff >> (-(char)(uVar2 * 8) & 0x1fU);
    if (0x1f < (int)(uVar2 * 8)) {
      uVar1 = 0xffffffff;
    }
    pCVar4 = Builder::makeConst<int>(&local_28,uVar1);
    this = (Binary *)MixedArena::allocSpace(&(local_28.wasm)->allocator,0x28,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this->op = AndInt32;
    this->left = value;
    this->right = (Expression *)pCVar4;
    Binary::finalize(this);
  }
  return (Expression *)this;
}

Assistant:

inline Expression* makePackedFieldGet(Expression* value,
                                      const Field& field,
                                      bool signed_,
                                      Module& wasm) {
  if (!field.isPacked()) {
    return value;
  }

  if (signed_) {
    return makeSignExt(value, field.getByteSize(), wasm);
  }

  Builder builder(wasm);
  auto mask = Bits::lowBitMask(field.getByteSize() * 8);
  return builder.makeBinary(AndInt32, value, builder.makeConst(int32_t(mask)));
}